

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * minja::Value::array(Value *__return_storage_ptr__,
                           vector<minja::Value,_std::allocator<minja::Value>_> *values)

{
  pointer pVVar1;
  Value *item;
  pointer __x;
  shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>_> array;
  shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>_> local_28;
  
  std::make_shared<std::vector<minja::Value,std::allocator<minja::Value>>>();
  pVVar1 = (values->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (values->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>)._M_impl.
             super__Vector_impl_data._M_start; __x != pVVar1; __x = __x + 1) {
    std::vector<minja::Value,_std::allocator<minja::Value>_>::push_back
              (local_28.
               super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,__x);
  }
  Value(__return_storage_ptr__,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.
              super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

static Value array(const std::vector<Value> values = {}) {
    auto array = std::make_shared<ArrayType>();
    for (const auto& item : values) {
      array->push_back(item);
    }
    return Value(array);
  }